

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M68KDisassembler.c
# Opt level: O1

void d68000_bra_16(m68k_info *info)

{
  byte bVar1;
  uint uVar2;
  ulong uVar3;
  
  uVar3 = (ulong)(info->pc - (int)info->baseAddress & info->address_mask);
  uVar2 = 0xaaaa;
  if (uVar3 + 2 <= info->code_len) {
    uVar2 = (uint)(ushort)(*(ushort *)(info->code + uVar3) << 8 |
                          *(ushort *)(info->code + uVar3) >> 8);
  }
  info->pc = info->pc + 2;
  MCInst_setOpcode(info->inst,0x1b);
  (info->extension).op_count = '\x01';
  (info->extension).op_size.type = M68K_SIZE_TYPE_CPU;
  (info->extension).op_size.field_1 = (anon_union_4_2_f1e43d3e_for_m68k_op_size_1)0x2;
  (info->extension).operands[0].type = M68K_OP_BR_DISP;
  (info->extension).operands[0].address_mode = M68K_AM_BRANCH_DISPLACEMENT;
  (info->extension).operands[0].br_disp.disp = (int)(short)uVar2 & 0xffff0000U | uVar2;
  (info->extension).operands[0].br_disp.disp_size = '\x02';
  bVar1 = info->groups_count;
  info->groups_count = bVar1 + 1;
  info->groups[bVar1] = '\x01';
  bVar1 = info->groups_count;
  info->groups_count = bVar1 + 1;
  info->groups[bVar1] = '\a';
  return;
}

Assistant:

static void d68000_bra_16(m68k_info *info)
{
	build_relative_branch(info, M68K_INS_BRA, 2, make_int_16(read_imm_16(info)));
}